

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O2

size_t kvtree_pack_size(kvtree *hash)

{
  kvtree_elem_struct *pkVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  size_t sVar5;
  
  if (hash == (kvtree *)0x0) {
    sVar5 = 4;
  }
  else {
    sVar5 = 4;
    while (pkVar1 = ((anon_struct_16_2_6a822a49_for_pointers *)hash)->le_next,
          pkVar1 != (kvtree_elem_struct *)0x0) {
      lVar4 = 1;
      if (pkVar1->key != (char *)0x0) {
        sVar2 = strlen(pkVar1->key);
        lVar4 = sVar2 + 1;
      }
      sVar3 = kvtree_pack_size(pkVar1->hash);
      sVar5 = lVar4 + sVar5 + sVar3;
      hash = (kvtree *)&pkVar1->pointers;
    }
  }
  return sVar5;
}

Assistant:

size_t kvtree_pack_size(const kvtree* hash)
{
  size_t size = 0;
  if (hash != NULL) {
    kvtree_elem* elem;

    /* add the size required to store the COUNT */
    size += sizeof(uint32_t);

    /* finally add the size of each element */
    LIST_FOREACH(elem, hash, pointers) {
      size += kvtree_elem_pack_size(elem);
    }
  } else {
    size += sizeof(uint32_t);
  }
  return size;
}